

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_format_text.c
# Opt level: O0

int log_policy_format_text_create(log_policy policy,log_policy_ctor ctor)

{
  undefined4 *instance;
  undefined4 *in_RSI;
  log_policy in_RDI;
  log_policy_format_text_ctor text_ctor;
  log_policy_format_text_data text_data;
  undefined4 local_4;
  
  instance = (undefined4 *)malloc(4);
  if (instance == (undefined4 *)0x0) {
    local_4 = 1;
  }
  else {
    if (in_RSI == (undefined4 *)0x0) {
      *instance = 0;
    }
    else {
      *instance = *in_RSI;
    }
    *instance = *in_RSI;
    log_policy_instantiate(in_RDI,instance,1);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int log_policy_format_text_create(log_policy policy, const log_policy_ctor ctor)
{
	log_policy_format_text_data text_data = malloc(sizeof(struct log_policy_format_text_data_type));

	const log_policy_format_text_ctor text_ctor = ctor;

	if (text_data == NULL)
	{
		return 1;
	}

	if (text_ctor != NULL)
	{
		text_data->flags = text_ctor->flags;
	}
	else
	{
		text_data->flags = LOG_POLICY_FORMAT_TEXT_EMPTY;
	}

	text_data->flags = text_ctor->flags;

	log_policy_instantiate(policy, text_data, LOG_POLICY_FORMAT_TEXT);

	return 0;
}